

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
     verifyInteger<8u,8u,8u,8u,unsigned_int>
               (GLint original_value,GLint positive_value,GLint negated_value)

{
  uint uVar1;
  byte bVar2;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  Integer<unsigned_int,_8U,_24U> negated_alpha;
  Integer<unsigned_int,_8U,_24U> positive_alpha;
  Integer<unsigned_int,_8U,_16U> negated_blue;
  Integer<unsigned_int,_8U,_16U> positive_blue;
  Integer<unsigned_int,_8U,_8U> negated_green;
  Integer<unsigned_int,_8U,_8U> positive_green;
  Integer<unsigned_int,_8U,_0U> negated_red;
  Integer<unsigned_int,_8U,_0U> positive_red;
  Integer<unsigned_int,_8U,_24U> local_50;
  Integer<unsigned_int,_8U,_24U> local_4c;
  Integer<unsigned_int,_8U,_16U> local_48;
  Integer<unsigned_int,_8U,_16U> local_44;
  Integer<unsigned_int,_8U,_8U> local_40;
  Integer<unsigned_int,_8U,_8U> local_3c;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  Integer<unsigned_int,_8U,_0U> local_18;
  Integer<unsigned_int,_8U,_0U> local_14;
  
  if (original_value != positive_value) {
    return false;
  }
  local_50.m_raw = negated_value;
  local_4c.m_raw = original_value;
  local_48.m_raw = negated_value;
  local_44.m_raw = original_value;
  local_40.m_raw = negated_value;
  local_3c.m_raw = original_value;
  local_18.m_raw = negated_value;
  local_14.m_raw = original_value;
  uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_0U>
          ::Get(&local_14);
  exp2l();
  local_20 = (long)ROUND(-(longdouble)1 + in_ST0);
  bVar2 = (byte)-uVar1;
  if ((uint)local_20 < -uVar1) {
    bVar2 = (byte)local_20;
  }
  uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<unsigned_int,_8U,_0U>
          ::Get(&local_18);
  if (bVar2 == uVar1) {
    uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
            Integer<unsigned_int,_8U,_16U>::Get(&local_44);
    exp2l();
    local_28 = (long)ROUND(-(longdouble)1 + in_ST1);
    bVar2 = (byte)-uVar1;
    if ((uint)local_28 < -uVar1) {
      bVar2 = (byte)local_28;
    }
    uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
            Integer<unsigned_int,_8U,_16U>::Get(&local_48);
    if (bVar2 == uVar1) {
      uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
              Integer<unsigned_int,_8U,_8U>::Get(&local_3c);
      exp2l();
      local_30 = (long)ROUND(-(longdouble)1 + in_ST2);
      bVar2 = (byte)-uVar1;
      if ((uint)local_30 < -uVar1) {
        bVar2 = (byte)local_30;
      }
      uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
              Integer<unsigned_int,_8U,_8U>::Get(&local_40);
      if (bVar2 == uVar1) {
        uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
                Integer<unsigned_int,_8U,_24U>::Get(&local_4c);
        exp2l();
        local_38 = (long)ROUND(-(longdouble)1 + in_ST3);
        bVar2 = (byte)-uVar1;
        if ((uint)local_38 < -uVar1) {
          bVar2 = (byte)local_38;
        }
        uVar1 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::
                Integer<unsigned_int,_8U,_24U>::Get(&local_50);
        return bVar2 == uVar1;
      }
    }
  }
  return false;
}

Assistant:

static bool verifyInteger(GLint original_value, GLint positive_value, GLint negated_value)
	{
		if (original_value != positive_value)
		{
			return false;
		}

		Integer<T, R, 0> positive_red(positive_value);
		Integer<T, R, 0> negated_red(negated_value);

		Integer<T, G, R> positive_green(positive_value);
		Integer<T, G, R> negated_green(negated_value);

		Integer<T, B, R + G> positive_blue(positive_value);
		Integer<T, B, R + G> negated_blue(negated_value);

		Integer<T, A, R + G + B> positive_alpha(positive_value);
		Integer<T, A, R + G + B> negated_alpha(negated_value);

		if (((0 != R) && (positive_red.GetNegated() != negated_red.Get())) ||
			((0 != B) && (positive_blue.GetNegated() != negated_blue.Get())) ||
			((0 != G) && (positive_green.GetNegated() != negated_green.Get())) ||
			((0 != A) && (positive_alpha.GetNegated() != negated_alpha.Get())))
		{
			return false;
		}

		return true;
	}